

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleClassifier::MergeFrom
          (TreeEnsembleClassifier *this,TreeEnsembleClassifier *from)

{
  void *pvVar1;
  LogMessage *other;
  TreeEnsembleParameters *this_00;
  StringVector *this_01;
  Int64Vector *this_02;
  StringVector *from_00;
  Int64Vector *from_01;
  TreeEnsembleParameters *from_02;
  LogFinisher local_51;
  LogMessage local_50;
  
  if (from == this) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/build_O3/mlmodel/format/TreeEnsemble.pb.cc"
               ,0x653);
    other = google::protobuf::internal::LogMessage::operator<<
                      (&local_50,"CHECK failed: (&from) != (this): ");
    google::protobuf::internal::LogFinisher::operator=(&local_51,other);
    google::protobuf::internal::LogMessage::~LogMessage(&local_50);
  }
  pvVar1 = (from->_internal_metadata_).
           super_InternalMetadataWithArenaBase<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::internal::InternalMetadataWithArenaLite>
           .ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadataWithArenaLite::DoMergeFrom
              (&this->_internal_metadata_,(string *)((ulong)pvVar1 & 0xfffffffffffffffe));
  }
  from_02 = from->treeensemble_;
  if (from_02 != (TreeEnsembleParameters *)0x0 &&
      from != (TreeEnsembleClassifier *)&_TreeEnsembleClassifier_default_instance_) {
    this_00 = this->treeensemble_;
    if (this_00 == (TreeEnsembleParameters *)0x0) {
      this_00 = (TreeEnsembleParameters *)operator_new(0x50);
      TreeEnsembleParameters::TreeEnsembleParameters(this_00);
      this->treeensemble_ = this_00;
      from_02 = from->treeensemble_;
    }
    if (from_02 == (TreeEnsembleParameters *)0x0) {
      from_02 = (TreeEnsembleParameters *)&_TreeEnsembleParameters_default_instance_;
    }
    TreeEnsembleParameters::MergeFrom(this_00,from_02);
  }
  if (from->postevaluationtransform_ != 0) {
    this->postevaluationtransform_ = from->postevaluationtransform_;
  }
  if (from->_oneof_case_[0] != 0x65) {
    if (from->_oneof_case_[0] != 100) {
      return;
    }
    if (this->_oneof_case_[0] == 100) {
      this_01 = (this->ClassLabels_).stringclasslabels_;
    }
    else {
      clear_ClassLabels(this);
      this->_oneof_case_[0] = 100;
      this_01 = (StringVector *)operator_new(0x30);
      StringVector::StringVector(this_01);
      (this->ClassLabels_).stringclasslabels_ = this_01;
      if (from->_oneof_case_[0] != 100) {
        from_00 = StringVector::default_instance();
        goto LAB_00253c00;
      }
    }
    from_00 = (from->ClassLabels_).stringclasslabels_;
LAB_00253c00:
    StringVector::MergeFrom(this_01,from_00);
    return;
  }
  if (this->_oneof_case_[0] == 0x65) {
    this_02 = (this->ClassLabels_).int64classlabels_;
  }
  else {
    clear_ClassLabels(this);
    this->_oneof_case_[0] = 0x65;
    this_02 = (Int64Vector *)operator_new(0x28);
    Int64Vector::Int64Vector(this_02);
    (this->ClassLabels_).int64classlabels_ = this_02;
    if (from->_oneof_case_[0] != 0x65) {
      from_01 = Int64Vector::default_instance();
      goto LAB_00253c12;
    }
  }
  from_01 = (from->ClassLabels_).int64classlabels_;
LAB_00253c12:
  Int64Vector::MergeFrom(this_02,from_01);
  return;
}

Assistant:

void TreeEnsembleClassifier::MergeFrom(const TreeEnsembleClassifier& from) {
// @@protoc_insertion_point(class_specific_merge_from_start:CoreML.Specification.TreeEnsembleClassifier)
  GOOGLE_DCHECK_NE(&from, this);
  _internal_metadata_.MergeFrom(from._internal_metadata_);
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  if (from.has_treeensemble()) {
    mutable_treeensemble()->::CoreML::Specification::TreeEnsembleParameters::MergeFrom(from.treeensemble());
  }
  if (from.postevaluationtransform() != 0) {
    set_postevaluationtransform(from.postevaluationtransform());
  }
  switch (from.ClassLabels_case()) {
    case kStringClassLabels: {
      mutable_stringclasslabels()->::CoreML::Specification::StringVector::MergeFrom(from.stringclasslabels());
      break;
    }
    case kInt64ClassLabels: {
      mutable_int64classlabels()->::CoreML::Specification::Int64Vector::MergeFrom(from.int64classlabels());
      break;
    }
    case CLASSLABELS_NOT_SET: {
      break;
    }
  }
}